

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_paddsw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  
  uVar1 = s->_w_ZMMReg[0];
  uVar2 = d->_w_ZMMReg[0];
  uVar3 = uVar2 + uVar1;
  if (SCARRY2(uVar2,uVar1)) {
    uVar3 = (short)(uVar2 + uVar1) >> 0xf ^ 0x8000;
  }
  uVar1 = d->_w_ZMMReg[1];
  d->_w_ZMMReg[0] = uVar3;
  uVar2 = s->_w_ZMMReg[1];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[1] = uVar3;
  uVar1 = d->_w_ZMMReg[2];
  uVar2 = s->_w_ZMMReg[2];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[2] = uVar3;
  uVar1 = d->_w_ZMMReg[3];
  uVar2 = s->_w_ZMMReg[3];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[3] = uVar3;
  uVar1 = d->_w_ZMMReg[4];
  uVar2 = s->_w_ZMMReg[4];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[4] = uVar3;
  uVar1 = d->_w_ZMMReg[5];
  uVar2 = s->_w_ZMMReg[5];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[5] = uVar3;
  uVar1 = d->_w_ZMMReg[6];
  uVar2 = s->_w_ZMMReg[6];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[6] = uVar3;
  uVar1 = d->_w_ZMMReg[7];
  uVar2 = s->_w_ZMMReg[7];
  uVar3 = uVar1 + uVar2;
  if (SCARRY2(uVar1,uVar2)) {
    uVar3 = (short)(uVar1 + uVar2) >> 0xf ^ 0x8000;
  }
  d->_w_ZMMReg[7] = uVar3;
  return;
}

Assistant:

static inline int satsw(int x)
{
    if (x < -32768) {
        return -32768;
    } else if (x > 32767) {
        return 32767;
    } else {
        return x;
    }
}